

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_taproot_util.cpp
# Opt level: O2

void __thiscall
TaprootUtil_ParseAndVerifyTapScriptParityBit_Test::TestBody
          (TaprootUtil_ParseAndVerifyTapScriptParityBit_Test *this)

{
  uint8_t tapleaf_bit;
  bool bVar1;
  char *pcVar2;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *nodes_00;
  Script *tapscript_00;
  uint8_t tapleaf_flag;
  bool parity;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertHelper local_1a8;
  uint8_t ver;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> nodes;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> script_stack;
  SchnorrPubkey pk;
  SchnorrSignature sig;
  ByteData annex;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> stack;
  Script tapscript;
  ScriptWitness local_78;
  Transaction tx2;
  
  std::__cxx11::string::string
            ((string *)&tapscript,
             "020000000001010513391eb3cb6529b86485dbee924a070a7e556c084ed6f0ff338d7a80335c450000000000ffffffff0130f1029500000000160014164e985d0fc92c927a66c0cbaf78e6ea389629d50341bf55a5d15cc7dd2b583f571db0d59be9b1838a81191ad0e057caf9670d1b7de599864d6bd5e68bd56bb6da4d44e1dfd2deec3a03792c066613c4f6560d4876e00122201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac61c11777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d5700000000"
             ,(allocator *)&sig);
  cfd::core::Transaction::Transaction(&tx2,(string *)&tapscript);
  std::__cxx11::string::~string((string *)&tapscript);
  cfd::core::Transaction::GetTxIn((TxInReference *)&tapscript,&tx2,0);
  cfd::core::ScriptWitness::ScriptWitness((ScriptWitness *)&sig,&local_78);
  cfd::core::ScriptWitness::GetWitness(&stack,(ScriptWitness *)&sig);
  cfd::core::ScriptWitness::~ScriptWitness((ScriptWitness *)&sig);
  cfd::core::AbstractTxInReference::~AbstractTxInReference((AbstractTxInReference *)&tapscript);
  cfd::core::SchnorrSignature::SchnorrSignature(&sig);
  parity = false;
  tapleaf_flag = '\0';
  cfd::core::SchnorrPubkey::SchnorrPubkey(&pk);
  nodes.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  nodes.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  nodes.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cfd::core::Script::Script(&tapscript);
  script_stack.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  script_stack.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  script_stack.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cfd::core::ByteData::ByteData(&annex);
  nodes_00 = &nodes;
  cfd::core::TaprootUtil::ParseTaprootSignData
            (&stack,&sig,&parity,&tapleaf_flag,&pk,nodes_00,&tapscript,&script_stack,&annex);
  cfd::core::SchnorrSignature::GetHex_abi_cxx11_((string *)&gtest_ar_1,&sig,false);
  pcVar2 = "";
  testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"\"","sig.GetHex()",(char (*) [1])0x602ce2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_1);
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0x1b2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar.success_ = parity;
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (parity == false) {
    testing::Message::Message((Message *)&gtest_ar__2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1,(internal *)&gtest_ar,(AssertionResult *)0x4373d4,"false",
               "true",(char *)nodes_00);
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0x1b3,(char *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_));
    testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    std::__cxx11::string::~string((string *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  ver = 0xc0;
  testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
            ((internal *)&gtest_ar_1,"ver","tapleaf_flag",&ver,&tapleaf_flag);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0x1b5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_((string *)&gtest_ar_1,&pk);
  testing::internal::CmpHelperEQ<char[65],std::__cxx11::string>
            ((internal *)&gtest_ar,
             "\"1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb\"","pk.GetHex()",
             (char (*) [65])0x476a4d,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_1);
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0x1b6,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar__2.success_ = true;
  gtest_ar__2._1_3_ = 0;
  gtest_ar._0_8_ =
       ((long)nodes.
              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
              _M_impl.super__Vector_impl_data._M_finish -
       (long)nodes.
             super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
             _M_impl.super__Vector_impl_data._M_start) / 0x18;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&gtest_ar_1,"2","nodes.size()",(int *)&gtest_ar__2,
             (unsigned_long *)&gtest_ar);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0x1b7,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  if ((long)nodes.
            super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)nodes.
            super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
            _M_impl.super__Vector_impl_data._M_start == 0x30) {
    cfd::core::ByteData256::GetHex_abi_cxx11_
              ((string *)&gtest_ar_1,
               nodes.
               super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
               _M_impl.super__Vector_impl_data._M_start);
    testing::internal::CmpHelperEQ<char[65],std::__cxx11::string>
              ((internal *)&gtest_ar,
               "\"4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d\"",
               "nodes[0].GetHex()",(char (*) [65])0x43ca03,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_1);
    std::__cxx11::string::~string((string *)&gtest_ar_1);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_1);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__2,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
                 ,0x1ba,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar__2,(Message *)&gtest_ar_1);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_1);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    cfd::core::ByteData256::GetHex_abi_cxx11_
              ((string *)&gtest_ar_1,
               nodes.
               super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
               _M_impl.super__Vector_impl_data._M_start + 1);
    testing::internal::CmpHelperEQ<char[65],std::__cxx11::string>
              ((internal *)&gtest_ar,
               "\"dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d57\"",
               "nodes[1].GetHex()",
               (char (*) [65])"dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d57",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_1);
    std::__cxx11::string::~string((string *)&gtest_ar_1);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_1);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__2,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
                 ,0x1bc,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar__2,(Message *)&gtest_ar_1);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_1);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  cfd::core::Script::GetHex_abi_cxx11_((string *)&gtest_ar_1,&tapscript);
  testing::internal::CmpHelperEQ<char[69],std::__cxx11::string>
            ((internal *)&gtest_ar,
             "\"201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac\"",
             "tapscript.GetHex()",
             (char (*) [69])"201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_1);
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0x1bf,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar__2.success_ = true;
  gtest_ar__2._1_3_ = 0;
  gtest_ar._0_8_ =
       ((long)script_stack.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_finish -
       (long)script_stack.
             super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
             super__Vector_impl_data._M_start) / 0x18;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&gtest_ar_1,"1","script_stack.size()",(int *)&gtest_ar__2,
             (unsigned_long *)&gtest_ar);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0x1c0,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  if ((long)script_stack.
            super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)script_stack.
            super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
            super__Vector_impl_data._M_start == 0x18) {
    cfd::core::ByteData::GetHex_abi_cxx11_
              ((string *)&gtest_ar_1,
               script_stack.
               super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl
               .super__Vector_impl_data._M_start);
    testing::internal::CmpHelperEQ<char[131],std::__cxx11::string>
              ((internal *)&gtest_ar,
               "\"bf55a5d15cc7dd2b583f571db0d59be9b1838a81191ad0e057caf9670d1b7de599864d6bd5e68bd56bb6da4d44e1dfd2deec3a03792c066613c4f6560d4876e001\""
               ,"script_stack[0].GetHex()",
               (char (*) [131])
               "bf55a5d15cc7dd2b583f571db0d59be9b1838a81191ad0e057caf9670d1b7de599864d6bd5e68bd56bb6da4d44e1dfd2deec3a03792c066613c4f6560d4876e001"
               ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_1);
    std::__cxx11::string::~string((string *)&gtest_ar_1);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_1);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__2,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
                 ,0x1c4,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar__2,(Message *)&gtest_ar_1);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_1);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  bVar1 = cfd::core::ByteData::IsEmpty(&annex);
  gtest_ar.success_ = bVar1;
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&gtest_ar__2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1,(internal *)&gtest_ar,(AssertionResult *)"annex.IsEmpty()",
               "false","true",(char *)nodes_00);
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0x1c6,(char *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_));
    testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    std::__cxx11::string::~string((string *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  bVar1 = parity;
  tapleaf_bit = tapleaf_flag;
  std::__cxx11::string::string
            ((string *)&gtest_ar_1,
             "262d16c95b41f6a90a360837b5e9c3e213334deacffaec0413f8b6e98ad40165",
             (allocator *)&local_1a8);
  cfd::core::SchnorrPubkey::SchnorrPubkey((SchnorrPubkey *)&gtest_ar,(string *)&gtest_ar_1);
  tapscript_00 = &tapscript;
  bVar1 = cfd::core::TaprootUtil::VerifyTaprootCommitment
                    (bVar1,tapleaf_bit,(SchnorrPubkey *)&gtest_ar,&pk,&nodes,tapscript_00,
                     (ByteData256 *)0x0,kMainnet);
  gtest_ar__2.success_ = bVar1;
  gtest_ar__2.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  if (!bVar1) {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1,(internal *)&gtest_ar__2,
               (AssertionResult *)
               "TaprootUtil::VerifyTaprootCommitment( parity, tapleaf_flag, SchnorrPubkey(\"262d16c95b41f6a90a360837b5e9c3e213334deacffaec0413f8b6e98ad40165\"), pk, nodes, tapscript)"
               ,"false","true",(char *)tapscript_00);
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0x1cb,(char *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_));
    testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    std::__cxx11::string::~string((string *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__2.message_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&annex);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&script_stack);
  cfd::core::Script::~Script(&tapscript);
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&nodes);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pk);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sig);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&stack);
  cfd::core::Transaction::~Transaction(&tx2);
  return;
}

Assistant:

TEST(TaprootUtil, ParseAndVerifyTapScriptParityBit) {
  Transaction tx2("020000000001010513391eb3cb6529b86485dbee924a070a7e556c084ed6f0ff338d7a80335c450000000000ffffffff0130f1029500000000160014164e985d0fc92c927a66c0cbaf78e6ea389629d50341bf55a5d15cc7dd2b583f571db0d59be9b1838a81191ad0e057caf9670d1b7de599864d6bd5e68bd56bb6da4d44e1dfd2deec3a03792c066613c4f6560d4876e00122201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac61c11777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d5700000000");
  auto stack = tx2.GetTxIn(0).GetScriptWitness().GetWitness();
  SchnorrSignature sig;
  bool parity = false;
  uint8_t tapleaf_flag = 0;
  SchnorrPubkey pk;
  std::vector<ByteData256> nodes;
  Script tapscript;
  std::vector<ByteData> script_stack;
  ByteData annex;
  TaprootUtil::ParseTaprootSignData(stack, &sig, &parity, &tapleaf_flag,
      &pk, &nodes, &tapscript, &script_stack, &annex);
  EXPECT_EQ("", sig.GetHex());
  EXPECT_TRUE(parity);
  uint8_t ver = TaprootScriptTree::kTapScriptLeafVersion;
  EXPECT_EQ(ver, tapleaf_flag);
  EXPECT_EQ("1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb", pk.GetHex());
  EXPECT_EQ(2, nodes.size());
  if (nodes.size() == 2) {
    EXPECT_EQ("4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d",
        nodes[0].GetHex());
    EXPECT_EQ("dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d57",
        nodes[1].GetHex());
  }
  EXPECT_EQ("201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac",
      tapscript.GetHex());
  EXPECT_EQ(1, script_stack.size());
  if (script_stack.size() == 1) {
    EXPECT_EQ(
        "bf55a5d15cc7dd2b583f571db0d59be9b1838a81191ad0e057caf9670d1b7de599864d6bd5e68bd56bb6da4d44e1dfd2deec3a03792c066613c4f6560d4876e001",
        script_stack[0].GetHex());
  }
  EXPECT_TRUE(annex.IsEmpty());

  EXPECT_TRUE(TaprootUtil::VerifyTaprootCommitment(
      parity, tapleaf_flag,
      SchnorrPubkey("262d16c95b41f6a90a360837b5e9c3e213334deacffaec0413f8b6e98ad40165"),
      pk, nodes, tapscript));
}